

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGlobalVC.cxx
# Opt level: O3

void __thiscall
cmCTestGlobalVC::WriteXMLDirectory
          (cmCTestGlobalVC *this,cmXMLWriter *xml,string *path,Directory *dir)

{
  pointer pcVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  size_type *psVar4;
  _Rb_tree_header *p_Var5;
  string full;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_80;
  long *local_60 [2];
  long local_50 [2];
  cmCTestGlobalVC *local_40;
  char *local_38;
  
  local_38 = "/";
  if (path->_M_string_length == 0) {
    local_38 = "";
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_40 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Directory","");
  cmXMLWriter::StartElement(xml,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"Name","");
  cmXMLWriter::StartElement(xml,&local_80);
  cmXMLWriter::Content<std::__cxx11::string>(xml,path);
  cmXMLWriter::EndElement(xml);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  p_Var3 = (dir->
           super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
           )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(dir->
            super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestVC::File>_>_>
            )._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var5) {
    do {
      pcVar1 = (path->_M_dataplus)._M_p;
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,pcVar1,pcVar1 + path->_M_string_length);
      std::__cxx11::string::append((char *)local_60);
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_60,*(ulong *)(p_Var3 + 1));
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80.field_2._8_8_ = plVar2[3];
      }
      else {
        local_80.field_2._M_allocated_capacity = *psVar4;
        local_80._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_80._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      cmCTestVC::WriteXMLEntry
                (&local_40->super_cmCTestVC,xml,path,(string *)(p_Var3 + 1),&local_80,
                 (File *)(p_Var3 + 2));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var5);
  }
  cmXMLWriter::EndElement(xml);
  return;
}

Assistant:

void cmCTestGlobalVC::WriteXMLDirectory(cmXMLWriter& xml,
                                        std::string const& path,
                                        Directory const& dir)
{
  const char* slash = path.empty() ? "" : "/";
  xml.StartElement("Directory");
  xml.Element("Name", path);
  for (auto const& f : dir) {
    std::string const full = path + slash + f.first;
    this->WriteXMLEntry(xml, path, f.first, full, f.second);
  }
  xml.EndElement(); // Directory
}